

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O1

size_t wasm::anon_unknown_0::shapeHash(Type a)

{
  uintptr_t *puVar1;
  Exactness EVar2;
  size_t sVar3;
  HeapType HVar4;
  ulong uVar5;
  const_iterator __end2;
  const_iterator __begin2;
  uintptr_t *puVar6;
  Type local_30;
  Type a_local;
  
  local_30.id = a.id;
  if ((a.id & 1) == 0 || a.id < 7) {
    if ((a.id & 1) == 0 && 6 < a.id) {
      HVar4 = wasm::Type::getHeapType(&local_30);
      if (HVar4.id < 0x7d) {
        HVar4 = wasm::Type::getHeapType(&local_30);
        sVar3 = HVar4.id + 0x1fb68949c000b4d6 ^ 0x9e3779b97f4a8c19;
      }
      else {
        uVar5 = 0x8181f0f0bf4a28cf;
        if (((uint)local_30.id & 3) != 2) {
          uVar5 = 0x8181f0f0bf4a28ce;
        }
        if (local_30.id < 7) {
          uVar5 = 0x8181f0f0bf4a28ce;
        }
        EVar2 = wasm::Type::getExactness(&local_30);
        sVar3 = (long)(int)EVar2 + -0x59b0673774c0e15f + uVar5 * 0x1000 ^ uVar5;
      }
    }
    else {
      sVar3 = 0x9e3779b97f4a8c16;
    }
  }
  else {
    puVar6 = *(uintptr_t **)(a.id & 0xfffffffffffffffe);
    puVar1 = (uintptr_t *)((long *)(a.id & 0xfffffffffffffffe))[1];
    uVar5 = (long)puVar1 - (long)puVar6 >> 3;
    for (; puVar1 != puVar6; puVar6 = puVar6 + 1) {
      sVar3 = shapeHash((Type)*puVar6);
      uVar5 = uVar5 ^ uVar5 * 0x1000 + -0x61c8864680b583eb + (uVar5 >> 4) + sVar3;
    }
    sVar3 = uVar5 + 0x9e3779b97f4a7c15;
  }
  return sVar3;
}

Assistant:

size_t shapeHash(Type a) {
  if (a.isTuple()) {
    auto digest = hash(0);
    hash_combine(digest, shapeHash(a.getTuple()));
    return digest;
  }
  auto digest = hash(1);
  if (!a.isRef()) {
    rehash(digest, 2);
    return digest;
  }
  if (a.getHeapType().isBasic()) {
    rehash(digest, 3);
    rehash(digest, a.getHeapType().getID());
    return digest;
  }
  rehash(digest, 4);
  rehash(digest, (int)a.getNullability());
  rehash(digest, (int)a.getExactness());
  return digest;
}